

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heatbath.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  reference this;
  ostream *poVar4;
  result_type_conflict rVar5;
  vector<double,_std::allocator<double>_> *this_00;
  exception *excp;
  size_t j;
  size_t i_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  transition_matrix;
  size_t i;
  double *w;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  vector<double,_std::allocator<double>_> weights;
  uniform_real_distribution<double> dist;
  engine_type eng;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffeb18;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffeb20;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffeb28;
  allocator_type *in_stack_ffffffffffffeb30;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffeb38;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffeb40;
  char *local_14b8;
  double in_stack_ffffffffffffeb58;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffeb60;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffeb68;
  char *weights_00;
  char *local_1478;
  ulong local_1420;
  ulong local_1418;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1410;
  ulong local_13f8;
  reference local_13f0;
  double *local_13e8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_13e0;
  vector<double,_std::allocator<double>_> *local_13d8;
  vector<double,_std::allocator<double>_> local_13c8 [210];
  int local_4;
  
  local_4 = 0;
  poVar2 = std::operator<<((ostream *)&std::cout,"number of bins = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(in_stack_ffffffffffffeb20,(result_type)in_stack_ffffffffffffeb18);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)0x101352);
  std::allocator<double>::allocator((allocator<double> *)0x101369);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffeb40,(size_type)in_stack_ffffffffffffeb38,
             in_stack_ffffffffffffeb30);
  std::allocator<double>::~allocator((allocator<double> *)0x101392);
  local_13d8 = local_13c8;
  local_13e0._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffeb18);
  local_13e8 = (double *)
               std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffeb18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_ffffffffffffeb20,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_ffffffffffffeb18);
    if (!bVar1) break;
    local_13f0 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_13e0);
    rVar5 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)in_stack_ffffffffffffeb20,
                       in_stack_ffffffffffffeb18);
    *local_13f0 = rVar5;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_13e0);
  }
  std::operator<<((ostream *)&std::cout,"[weights]\n");
  for (local_13f8 = 0; local_13f8 < 8; local_13f8 = local_13f8 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_13c8,local_13f8);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar3);
    std::operator<<(poVar2,' ');
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x10154c);
  bcl::heatbath::
  generate_transition_matrix_resize<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffeb30,
             in_stack_ffffffffffffeb28);
  std::operator<<((ostream *)&std::cout,"[transition matrix]\n");
  for (local_1418 = 0; local_1418 < 8; local_1418 = local_1418 + 1) {
    for (local_1420 = 0; local_1420 < 8; local_1420 = local_1420 + 1) {
      this = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&local_1410,local_1418);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this,local_1420);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar3);
      std::operator<<(poVar2,' ');
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)&std::cout,"[check transition matrix]\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"probability conservation = ");
  bVar1 = bcl::
          check_probability_conservation<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
                    (in_stack_ffffffffffffeb38,(double)in_stack_ffffffffffffeb30);
  if (bVar1) {
    local_1478 = "pass";
  }
  else {
    local_1478 = "fail";
  }
  poVar2 = std::operator<<(poVar2,local_1478);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"detailed balance condition = ");
  bVar1 = bcl::
          check_detailed_balance<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
                    (in_stack_ffffffffffffeb68,in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
  if (bVar1) {
    weights_00 = "pass";
  }
  else {
    weights_00 = "fail";
  }
  poVar2 = std::operator<<(poVar2,weights_00);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"balance condition = ");
  bVar1 = bcl::
          check_balance_condition<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
                    ((vector<double,_std::allocator<double>_> *)weights_00,
                     (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)poVar2,(double)poVar4);
  if (bVar1) {
    local_14b8 = "pass";
  }
  else {
    local_14b8 = "fail";
  }
  poVar2 = std::operator<<(poVar4,local_14b8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"average rejection = ");
  this_00 = (vector<double,_std::allocator<double>_> *)
            bcl::
            average_rejection<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
                      ((vector<double,_std::allocator<double>_> *)poVar2,
                       (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)poVar4);
  poVar2 = (ostream *)std::ostream::operator<<(poVar4,(double)this_00);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  return local_4;
}

Assistant:

int main() {
try {
  std::cout << "number of bins = " << n << std::endl;

  // random number generator
  typedef std::mt19937 engine_type;
  engine_type eng(29411);
  std::uniform_real_distribution<> dist;

  // generate weights
  std::vector<double> weights(n);
  for (auto& w : weights) w = dist(eng);
  std::cout << "[weights]\n";
  for (std::size_t i = 0; i < n; ++i) std::cout << weights[i] << ' ';
  std::cout << std::endl;

  // generate transtition matrix
  std::vector<std::vector<double> > transition_matrix;
  bcl::heatbath::generate_transition_matrix_resize(weights, transition_matrix);

  std::cout << "[transition matrix]\n";
  for (std::size_t i = 0; i < n; ++i) {
    for (std::size_t j = 0; j < n; ++j) {
      std::cout << transition_matrix[i][j] << ' ';
    }
    std::cout << std::endl;
  }

  // check transition matrix
  std::cout << "[check transition matrix]\n";
  std::cout << "probability conservation = "
            << (bcl::check_probability_conservation(transition_matrix) ? "pass" : "fail")
            << std::endl;
  std::cout << "detailed balance condition = "
            << (bcl::check_detailed_balance(weights, transition_matrix) ? "pass" : "fail")
            << std::endl;
  std::cout << "balance condition = "
            << (bcl::check_balance_condition(weights, transition_matrix) ? "pass" : "fail")
            << std::endl;

  std::cout << "average rejection = " << bcl::average_rejection(weights, transition_matrix) 
            << std::endl;
}
catch (const std::exception& excp) {
  std::cerr << excp.what() << std::endl;
  std::exit(-1); }
catch (...) {
  std::cerr << "Unknown exception occurred!" << std::endl;
  std::exit(-1); }
}